

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_bit_nary(jit_State *J,RecordFFData *rd)

{
  undefined2 uVar1;
  TRef TVar2;
  int iVar3;
  TRef TVar4;
  long in_RSI;
  long in_RDI;
  BCReg i;
  uint32_t op;
  TRef tr;
  TRef in_stack_ffffffffffffffd4;
  uint tr_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffdc;
  
  TVar2 = lj_opt_narrow_tobit((jit_State *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              in_stack_ffffffffffffffd4);
  iVar5 = *(int *)(in_RSI + 0x10);
  tr_00 = 1;
  while (*(int *)(*(long *)(in_RDI + 0x80) + (ulong)tr_00 * 4) != 0) {
    iVar3 = iVar5 << 8;
    uVar1 = (undefined2)TVar2;
    TVar4 = lj_opt_narrow_tobit((jit_State *)CONCAT44(TVar2,iVar5),tr_00);
    *(ushort *)(in_RDI + 0x9c) = (ushort)iVar3 | 0x13;
    *(undefined2 *)(in_RDI + 0x98) = uVar1;
    *(short *)(in_RDI + 0x9a) = (short)TVar4;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(TVar2,iVar5));
    tr_00 = tr_00 + 1;
  }
  **(TRef **)(in_RDI + 0x80) = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_nary(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_opt_narrow_tobit(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++)
    tr = emitir(IRTI(op), tr, lj_opt_narrow_tobit(J, J->base[i]));
  J->base[0] = tr;
}